

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySetDefinition::~IfcPropertySetDefinition
          (IfcPropertySetDefinition *this)

{
  IfcRoot::~IfcRoot((IfcRoot *)this,&PTR_construction_vtable_24__00739e70);
  return;
}

Assistant:

IfcPropertySetDefinition() : Object("IfcPropertySetDefinition") {}